

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

uint __thiscall llvm::ARM::parseArchExt(ARM *this,StringRef ArchExt)

{
  uint uVar1;
  char *__n;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0x10;
  while( true ) {
    __n = *(char **)(&UNK_00215088 + lVar3);
    uVar1 = *(uint *)((long)&(anonymous_namespace)::ARCHExtNames + lVar3);
    if (__n == ArchExt.Data) {
      if (__n == (char *)0x0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(this,*(void **)(&UNK_00215080 + lVar3),(size_t)__n);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) break;
    lVar3 = lVar3 + 0x28;
    if (lVar3 == 0x358) {
      return 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::ARM::parseArchExt(StringRef ArchExt) {
  for (const auto A : ARCHExtNames) {
    if (ArchExt == A.getName())
      return A.ID;
  }
  return ARM::AEK_INVALID;
}